

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

VariableP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::ExpandContext::genSym<float>(ExpandContext *this,string *baseName)

{
  int iVar1;
  int *piVar2;
  long *plVar3;
  size_type *psVar4;
  ulong *in_RDX;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  VariableP<float> VVar6;
  string local_1d8;
  long *local_1b8 [2];
  long local_1a8 [2];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  SharedPtrStateBase *pSVar5;
  
  piVar2 = (int *)(baseName->_M_dataplus)._M_p;
  iVar1 = *piVar2;
  *piVar2 = iVar1 + 1;
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::operator<<(local_198,iVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_1b8,0,(char *)0x0,*in_RDX);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_1d8.field_2._M_allocated_capacity = *psVar4;
    local_1d8.field_2._8_8_ = plVar3[3];
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  }
  else {
    local_1d8.field_2._M_allocated_capacity = *psVar4;
    local_1d8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_1d8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  VVar6 = variable<float>((BuiltinPrecisionTests *)this,&local_1d8);
  pSVar5 = VVar6.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_state;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    pSVar5 = extraout_RDX;
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
    pSVar5 = extraout_RDX_00;
  }
  VVar6.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_state = pSVar5;
  VVar6.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr =
       (Variable<float> *)this;
  return (VariableP<float>)
         VVar6.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>;
}

Assistant:

VariableP<T>		genSym			(const string& baseName)
	{
		return variable<T>(baseName + de::toString(m_symCounter()));
	}